

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O1

int ZXing::Pdf417::Encoder::GetRecommendedMinimumErrorCorrectionLevel(int n)

{
  int iVar1;
  
  iVar1 = 2;
  if (((0x28 < n) && (iVar1 = 3, 0xa0 < n)) && (iVar1 = 4, 0x140 < n)) {
    iVar1 = (0x35f < n) + 5;
  }
  return iVar1;
}

Assistant:

int
Encoder::GetRecommendedMinimumErrorCorrectionLevel(int n) {
	if (n <= 40) {
		return 2;
	}
	if (n <= 160) {
		return 3;
	}
	if (n <= 320) {
		return 4;
	}
	if (n <= 863) {
		return 5;
	}
	return 6;
}